

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleInterpolationTests.cpp
# Opt level: O3

void __thiscall
vkt::pipeline::multisample::
MSInstance<vkt::pipeline::multisample::MSInstanceInterpolateScreenPosition>::uploadVertexData
          (MSInstance<vkt::pipeline::multisample::MSInstanceInterpolateScreenPosition> *this,
          Allocation *vertexBufferAllocation,VertexDataDesc *vertexDataDescripton)

{
  pointer __src;
  vector<vkt::pipeline::multisample::VertexDataNdcScreen,_std::allocator<vkt::pipeline::multisample::VertexDataNdcScreen>_>
  vertices;
  UVec3 layerSize;
  vector<vkt::pipeline::multisample::VertexDataNdcScreen,_std::allocator<vkt::pipeline::multisample::VertexDataNdcScreen>_>
  local_68;
  VertexDataNdcScreen local_48;
  uint local_2c;
  uint local_28;
  
  getLayerSize(IMAGE_TYPE_2D,
               &(this->super_MSInstanceBaseResolve).super_MultisampleInstanceBase.m_imageMSParams.
                imageSize);
  local_68.
  super__Vector_base<vkt::pipeline::multisample::VertexDataNdcScreen,_std::allocator<vkt::pipeline::multisample::VertexDataNdcScreen>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.
  super__Vector_base<vkt::pipeline::multisample::VertexDataNdcScreen,_std::allocator<vkt::pipeline::multisample::VertexDataNdcScreen>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<vkt::pipeline::multisample::VertexDataNdcScreen,_std::allocator<vkt::pipeline::multisample::VertexDataNdcScreen>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.positionNdc.m_data[0] = -1.0;
  local_48.positionNdc.m_data[1] = -1.0;
  local_48.positionNdc.m_data[2] = 0.0;
  local_48.positionNdc.m_data[3] = 1.0;
  local_48.positionScreen.m_data[0] = 0.0;
  local_48.positionScreen.m_data[1] = 0.0;
  std::
  vector<vkt::pipeline::multisample::VertexDataNdcScreen,_std::allocator<vkt::pipeline::multisample::VertexDataNdcScreen>_>
  ::emplace_back<vkt::pipeline::multisample::VertexDataNdcScreen>(&local_68,&local_48);
  local_48.positionNdc.m_data[0] = 1.0;
  local_48.positionNdc.m_data[1] = -1.0;
  local_48.positionNdc.m_data[2] = 0.0;
  local_48.positionNdc.m_data[3] = 1.0;
  local_48.positionScreen.m_data[1] = 0.0;
  local_48.positionScreen.m_data[0] = (float)local_2c;
  std::
  vector<vkt::pipeline::multisample::VertexDataNdcScreen,_std::allocator<vkt::pipeline::multisample::VertexDataNdcScreen>_>
  ::emplace_back<vkt::pipeline::multisample::VertexDataNdcScreen>(&local_68,&local_48);
  local_48.positionNdc.m_data[0] = -1.0;
  local_48.positionNdc.m_data[1] = 1.0;
  local_48.positionNdc.m_data[2] = 0.0;
  local_48.positionNdc.m_data[3] = 1.0;
  local_48.positionScreen.m_data = (float  [2])((ulong)(uint)(float)local_28 << 0x20);
  std::
  vector<vkt::pipeline::multisample::VertexDataNdcScreen,_std::allocator<vkt::pipeline::multisample::VertexDataNdcScreen>_>
  ::emplace_back<vkt::pipeline::multisample::VertexDataNdcScreen>(&local_68,&local_48);
  local_48.positionNdc.m_data[0] = 1.0;
  local_48.positionNdc.m_data[1] = 1.0;
  local_48.positionNdc.m_data[2] = 0.0;
  local_48.positionNdc.m_data[3] = 1.0;
  local_48.positionScreen.m_data[1] = (float)local_28;
  std::
  vector<vkt::pipeline::multisample::VertexDataNdcScreen,_std::allocator<vkt::pipeline::multisample::VertexDataNdcScreen>_>
  ::emplace_back<vkt::pipeline::multisample::VertexDataNdcScreen>(&local_68,&local_48);
  __src = (pointer)0x0;
  if (local_68.
      super__Vector_base<vkt::pipeline::multisample::VertexDataNdcScreen,_std::allocator<vkt::pipeline::multisample::VertexDataNdcScreen>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_68.
      super__Vector_base<vkt::pipeline::multisample::VertexDataNdcScreen,_std::allocator<vkt::pipeline::multisample::VertexDataNdcScreen>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    __src = local_68.
            super__Vector_base<vkt::pipeline::multisample::VertexDataNdcScreen,_std::allocator<vkt::pipeline::multisample::VertexDataNdcScreen>_>
            ._M_impl.super__Vector_impl_data._M_start;
  }
  memcpy(vertexBufferAllocation->m_hostPtr,__src,vertexDataDescripton->dataSize);
  if (local_68.
      super__Vector_base<vkt::pipeline::multisample::VertexDataNdcScreen,_std::allocator<vkt::pipeline::multisample::VertexDataNdcScreen>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.
                    super__Vector_base<vkt::pipeline::multisample::VertexDataNdcScreen,_std::allocator<vkt::pipeline::multisample::VertexDataNdcScreen>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.
                          super__Vector_base<vkt::pipeline::multisample::VertexDataNdcScreen,_std::allocator<vkt::pipeline::multisample::VertexDataNdcScreen>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.
                          super__Vector_base<vkt::pipeline::multisample::VertexDataNdcScreen,_std::allocator<vkt::pipeline::multisample::VertexDataNdcScreen>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void MSInstance<MSInstanceInterpolateScreenPosition>::uploadVertexData (const Allocation& vertexBufferAllocation, const VertexDataDesc& vertexDataDescripton) const
{
	const tcu::UVec3 layerSize		= getLayerSize(IMAGE_TYPE_2D, m_imageMSParams.imageSize);
	const float		 screenSizeX	= static_cast<float>(layerSize.x());
	const float		 screenSizeY	= static_cast<float>(layerSize.y());

	std::vector<VertexDataNdcScreen> vertices;

	vertices.push_back(VertexDataNdcScreen(tcu::Vec4(-1.0f, -1.0f, 0.0f, 1.0f), tcu::Vec2(0.0f, 0.0f)));
	vertices.push_back(VertexDataNdcScreen(tcu::Vec4( 1.0f, -1.0f, 0.0f, 1.0f), tcu::Vec2(screenSizeX, 0.0f)));
	vertices.push_back(VertexDataNdcScreen(tcu::Vec4(-1.0f,  1.0f, 0.0f, 1.0f), tcu::Vec2(0.0f, screenSizeY)));
	vertices.push_back(VertexDataNdcScreen(tcu::Vec4( 1.0f,  1.0f, 0.0f, 1.0f), tcu::Vec2(screenSizeX, screenSizeY)));

	deMemcpy(vertexBufferAllocation.getHostPtr(), dataPointer(vertices), static_cast<std::size_t>(vertexDataDescripton.dataSize));
}